

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

int __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
::size(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
       *this)

{
  int iVar1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar2
  ;
  int iVar3;
  int iVar4;
  
  pFVar2 = (this->left_->fadexpr_).right_;
  iVar1 = (((((((this->left_->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  iVar3 = (((((pFVar2->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar4 = (((pFVar2->fadexpr_).right_)->dx_).num_elts;
  if (iVar4 < iVar3) {
    iVar4 = iVar3;
  }
  if (iVar4 < iVar1) {
    iVar4 = iVar1;
  }
  iVar1 = (((this->right_->fadexpr_).left_)->dx_).num_elts;
  iVar3 = (((((((this->right_->fadexpr_).right_)->fadexpr_).right_)->fadexpr_).right_)->dx_).
          num_elts;
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }